

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::equalityRowAddition<HighsTripletPositionSlice>
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt stayrow,HighsInt removerow,
          double scale,HighsMatrixSlice<HighsTripletPositionSlice> *rowvector)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  Result RVar5;
  pointer pdVar6;
  HighsLp *pHVar7;
  pointer piVar8;
  HighsCDouble HVar9;
  vector<int,_std::allocator<int>_> stay_rowpositions;
  _Vector_base<int,_std::allocator<int>_> local_68;
  HighsCDouble local_50;
  HighsCDouble local_40;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getRowPositions(this,stayrow,(vector<int,_std::allocator<int>_> *)&local_68);
  HighsPostsolveStack::equalityRowAddition<HighsTripletPositionSlice>
            (postsolve_stack,removerow,stayrow,scale,rowvector);
  piVar3 = local_68._M_impl.super__Vector_impl_data._M_finish;
  for (piVar8 = local_68._M_impl.super__Vector_impl_data._M_start; piVar8 != piVar3;
      piVar8 = piVar8 + 1) {
    iVar2 = *piVar8;
    uVar4 = findNonzero(this,removerow,
                        (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2]);
    if (uVar4 == 0xffffffff) {
      addToMatrix(this,removerow,
                  (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2],
                  (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2] * scale);
    }
    else {
      unlink(this,(char *)(ulong)uVar4);
    }
  }
  pHVar7 = this->model;
  pdVar6 = (pHVar7->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar6[removerow];
  if (dVar1 < INFINITY) {
    local_50.lo = 0.0;
    local_50.hi = scale;
    local_40 = HighsCDouble::operator*(&local_50,pdVar6[stayrow]);
    HVar9 = HighsCDouble::operator+(&local_40,dVar1);
    pHVar7 = this->model;
    pdVar6 = (pHVar7->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6[removerow] = HVar9.lo + HVar9.hi;
  }
  dVar1 = (pHVar7->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[removerow];
  if (-INFINITY < dVar1) {
    local_50.lo = 0.0;
    local_50.hi = scale;
    local_40 = HighsCDouble::operator*(&local_50,pdVar6[stayrow]);
    HVar9 = HighsCDouble::operator+(&local_40,dVar1);
    (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[removerow] = HVar9.lo + HVar9.hi;
  }
  RVar5 = rowPresolve(this,postsolve_stack,removerow);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return RVar5;
}

Assistant:

HPresolve::Result HPresolve::equalityRowAddition(
    HighsPostsolveStack& postsolve_stack, HighsInt stayrow, HighsInt removerow,
    double scale, const HighsMatrixSlice<RowStorageFormat>& rowvector) {
  // extract non-zero positions
  std::vector<HighsInt> stay_rowpositions;
  getRowPositions(stayrow, stay_rowpositions);

  // update postsolve information
  postsolve_stack.equalityRowAddition(removerow, stayrow, scale, rowvector);

  // iterate over non-zero positions instead of iterating over the
  // HighsMatrixSlice because the latter contains pointers to Acol and Avalue
  // that may be invalidated if these vectors are reallocated
  // (see std::vector::push_back performed in HPresolve::addToMatrix).
  for (HighsInt rowiter : stay_rowpositions) {
    HighsInt pos = findNonzero(removerow, Acol[rowiter]);
    if (pos != -1)
      unlink(pos);  // all common nonzeros are cancelled, as the rows are
                    // parallel
    else            // might introduce a singleton
      addToMatrix(removerow, Acol[rowiter], scale * Avalue[rowiter]);
  }

  if (model->row_upper_[removerow] != kHighsInf)
    model->row_upper_[removerow] = static_cast<double>(
        model->row_upper_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);
  if (model->row_lower_[removerow] != -kHighsInf)
    model->row_lower_[removerow] = static_cast<double>(
        model->row_lower_[removerow] +
        static_cast<HighsCDouble>(scale) * model->row_upper_[stayrow]);

  // row is now a singleton row, doubleton equation, or a row
  // that contains only singletons and we let the normal row presolve
  // handle the cases
  HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, removerow));
  return Result::kOk;
}